

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::DtlsSession::Init
          (Error *__return_storage_ptr__,DtlsSession *this,DtlsConfig *aConfig)

{
  mbedtls_ssl_config *conf;
  mbedtls_ssl_context *ssl;
  char cVar1;
  pointer piVar2;
  uchar *puVar3;
  uchar *puVar4;
  mbedtls_ssl_cookie_ctx *pmVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  code *in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  size_type sStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  code *local_a8;
  mbedtls_ssl_cookie_ctx *local_a0;
  string local_98;
  writer write;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  conf = &this->mConfig;
  iVar6 = mbedtls_ssl_config_defaults(conf,(uint)this->mIsServer,1,0);
  if (iVar6 == 0) {
    mbedtls_ssl_conf_authmode(conf,2);
    mbedtls_debug_set_threshold(10);
    if (aConfig->mEnableDebugLogging == true) {
      mbedtls_ssl_conf_dbg(conf,HandleMbedtlsDebug,(void *)0x0);
    }
    mbedtls_ssl_conf_handshake_timeout(conf,8000,60000);
    piVar2 = (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar2) {
      (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar2;
    }
    local_a0 = (mbedtls_ssl_cookie_ctx *)&this->mCipherSuites;
    if ((aConfig->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (aConfig->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->mPSK,&aConfig->mPSK);
      local_d0._0_4_ = 0xc0ff;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)local_a0,(int *)local_d0);
    }
    puVar3 = (aConfig->mCaChain).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (aConfig->mCaChain).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((puVar3 != puVar4) ||
        ((aConfig->mOwnCert).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (aConfig->mOwnCert).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish)) ||
       ((aConfig->mOwnKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start !=
        (aConfig->mOwnKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish)) {
      iVar6 = mbedtls_x509_crt_parse(&this->mCaChain,puVar3,(long)puVar4 - (long)puVar3);
      if (iVar6 == 0) {
        puVar3 = (aConfig->mOwnCert).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6 = mbedtls_x509_crt_parse
                          (&this->mOwnCert,puVar3,
                           (long)(aConfig->mOwnCert).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
        if (iVar6 == 0) {
          puVar3 = (aConfig->mOwnKey).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          in_R9 = mbedtls_ctr_drbg_random;
          iVar6 = mbedtls_pk_parse_key
                            (&this->mOwnKey,puVar3,
                             (long)(aConfig->mOwnKey).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3,
                             (uchar *)0x0,0,mbedtls_ctr_drbg_random,&this->mCtrDrbg);
          if (iVar6 == 0) {
            local_d0._0_4_ = 0xc0ae;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)local_a0,(int *)local_d0);
            mbedtls_ssl_conf_ca_chain(conf,&this->mCaChain,(mbedtls_x509_crl *)0x0);
            iVar6 = mbedtls_ssl_conf_own_cert(conf,&this->mOwnCert,&this->mOwnKey);
            if (iVar6 != 0) {
              ErrorFromMbedtlsError((Error *)local_d0,iVar6);
              goto LAB_0018cb6f;
            }
            goto LAB_0018cfce;
          }
          local_d0._0_4_ = string_type;
          local_c8._M_p = "bad private key; {}";
          sStack_c0 = 0x13;
          local_b8._M_allocated_capacity = 0x100000000;
          local_a8 = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar7 = "bad private key; {}";
          local_b8._8_8_ = (format_string_checker<char> *)local_d0;
          while (pcVar8 = pcVar7, pcVar8 != "") {
            pcVar7 = pcVar8 + 1;
            if (*pcVar8 == '}') {
              if ((pcVar7 == "") || (*pcVar7 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar7 = pcVar8 + 2;
            }
            else if (*pcVar8 == '{') {
              pcVar7 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                 (pcVar8,"",(format_string_checker<char> *)local_d0);
            }
          }
          ErrorFromMbedtlsError((Error *)local_d0,iVar6);
          write.handler_ = (format_string_checker<char> *)local_c8._M_p;
          fmt_01.size_ = 0xd;
          fmt_01.data_ = (char *)0x13;
          args_01.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)in_R9;
          args_01.desc_ = (unsigned_long_long)&write;
          ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"bad private key; {}",fmt_01,args_01);
          local_58._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_98);
        }
        else {
          local_d0._0_4_ = string_type;
          local_c8._M_p = "bad certificate; {}";
          sStack_c0 = 0x13;
          local_b8._M_allocated_capacity = 0x100000000;
          local_a8 = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar7 = "bad certificate; {}";
          local_b8._8_8_ = (format_string_checker<char> *)local_d0;
          while (pcVar8 = pcVar7, pcVar8 != "") {
            pcVar7 = pcVar8 + 1;
            if (*pcVar8 == '}') {
              if ((pcVar7 == "") || (*pcVar7 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar7 = pcVar8 + 2;
            }
            else if (*pcVar8 == '{') {
              pcVar7 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                 (pcVar8,"",(format_string_checker<char> *)local_d0);
            }
          }
          ErrorFromMbedtlsError((Error *)local_d0,iVar6);
          write.handler_ = (format_string_checker<char> *)local_c8._M_p;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x13;
          args_00.field_1 =
               (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                  )in_R9;
          args_00.desc_ = (unsigned_long_long)&write;
          ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"bad certificate; {}",fmt_00,args_00);
          local_58._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_98);
        }
      }
      else {
        local_d0._0_4_ = string_type;
        local_c8._M_p = "bad CA certificate; {}";
        sStack_c0 = 0x16;
        local_b8._M_allocated_capacity = 0x100000000;
        local_a8 = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar7 = "bad CA certificate; {}";
        local_b8._8_8_ = (format_string_checker<char> *)local_d0;
        while (pcVar8 = pcVar7, pcVar8 != "") {
          pcVar7 = pcVar8 + 1;
          if (*pcVar8 == '}') {
            if ((pcVar7 == "") || (*pcVar7 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar7 = pcVar8 + 2;
          }
          else if (*pcVar8 == '{') {
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar8,"",(format_string_checker<char> *)local_d0);
          }
        }
        ErrorFromMbedtlsError((Error *)local_d0,iVar6);
        write.handler_ = (format_string_checker<char> *)local_c8._M_p;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x16;
        args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                        )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                          )in_R9;
        args.desc_ = (unsigned_long_long)&write;
        ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"bad CA certificate; {}",fmt,args);
        local_58._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_98);
      }
LAB_0018cf48:
      Error::operator=(__return_storage_ptr__,(Error *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)&local_98);
      goto LAB_0018cf6d;
    }
LAB_0018cfce:
    pmVar5 = local_a0;
    local_d0._0_4_ = none_type;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)local_a0,(int *)local_d0);
    mbedtls_ssl_conf_ciphersuites
              (conf,(((_Vector_impl *)&(pmVar5->hmac_ctx).md_info)->super__Vector_impl_data).
                    _M_start);
    ssl = &this->mSsl;
    mbedtls_ssl_set_export_keys_cb(ssl,HandleMbedtlsExportKeys,this);
    mbedtls_ssl_conf_rng(conf,mbedtls_ctr_drbg_random,&this->mCtrDrbg);
    if (this->mIsServer == true) {
      local_a0 = &this->mCookie;
      iVar6 = mbedtls_ssl_cookie_setup(local_a0,mbedtls_ctr_drbg_random,&this->mCtrDrbg);
      if (iVar6 != 0) {
        ErrorFromMbedtlsError((Error *)local_d0,iVar6);
        goto LAB_0018cb6f;
      }
      mbedtls_ssl_conf_dtls_cookies(conf,mbedtls_ssl_cookie_write,mbedtls_ssl_cookie_check,local_a0)
      ;
    }
    mbedtls_ssl_set_bio(ssl,(this->mSocket).
                            super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,Socket::Send,Socket::Receive,(mbedtls_ssl_recv_timeout_t *)0x0);
    mbedtls_ssl_set_timer_cb(ssl,&this->mHandshakeTimer,DtlsTimer::SetDelay,DtlsTimer::GetDelay);
    iVar6 = mbedtls_ssl_conf_max_frag_len(conf,'\x02');
    if (iVar6 == 0) {
      mbedtls_ssl_set_mtu(ssl,0x500);
      iVar6 = mbedtls_ssl_setup(ssl,conf);
      if (iVar6 == 0) {
        puVar3 = (aConfig->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (aConfig->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar3 == puVar4) {
          return __return_storage_ptr__;
        }
        iVar6 = mbedtls_ssl_set_hs_ecjpake_password(ssl,puVar3,(long)puVar4 - (long)puVar3);
        if (iVar6 == 0) {
          return __return_storage_ptr__;
        }
        local_d0._0_4_ = string_type;
        local_c8._M_p = "set DTLS pre-shared key failed; {}";
        sStack_c0 = 0x22;
        local_b8._M_allocated_capacity = 0x100000000;
        local_b8._8_8_ = local_d0;
        local_a8 = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar7 = "set DTLS pre-shared key failed; {}";
        write.handler_ = (format_string_checker<char> *)local_b8._8_8_;
        while (pcVar7 != "") {
          cVar1 = *pcVar7;
          pcVar8 = pcVar7;
          while (cVar1 != '{') {
            pcVar8 = pcVar8 + 1;
            if (pcVar8 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()(&write,pcVar7,"");
              goto LAB_0018d1d2;
            }
            cVar1 = *pcVar8;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar7,pcVar8);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar8,"",(format_string_checker<char> *)local_d0);
        }
LAB_0018d1d2:
        ErrorFromMbedtlsError((Error *)local_d0,iVar6);
        write.handler_ = (format_string_checker<char> *)local_c8._M_p;
        fmt_02.size_ = 0xd;
        fmt_02.data_ = (char *)0x22;
        args_02.field_1 =
             (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )in_R9;
        args_02.desc_ = (unsigned_long_long)&write;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_98,(v10 *)"set DTLS pre-shared key failed; {}",fmt_02,args_02);
        local_58._0_4_ = kSecurity;
        std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_98);
        goto LAB_0018cf48;
      }
      ErrorFromMbedtlsError((Error *)local_d0,iVar6);
    }
    else {
      ErrorFromMbedtlsError((Error *)local_d0,iVar6);
    }
  }
  else {
    ErrorFromMbedtlsError((Error *)local_d0,iVar6);
  }
LAB_0018cb6f:
  Error::operator=(__return_storage_ptr__,(Error *)local_d0);
LAB_0018cf6d:
  std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Init(const DtlsConfig &aConfig)
{
    Error error;

    if (int fail = mbedtls_ssl_config_defaults(&mConfig, mIsServer, MBEDTLS_SSL_TRANSPORT_DATAGRAM,
                                               MBEDTLS_SSL_PRESET_DEFAULT))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    mbedtls_ssl_conf_authmode(&mConfig, kAuthMode);

    // Debug
    mbedtls_debug_set_threshold(10);

    if (aConfig.mEnableDebugLogging)
    {
        mbedtls_ssl_conf_dbg(&mConfig, HandleMbedtlsDebug, nullptr);
    }

    // Timeouts
    mbedtls_ssl_conf_handshake_timeout(&mConfig, kDtlsHandshakeTimeoutMin * 1000, kDtlsHandshakeTimeoutMax * 1000);

    mCipherSuites.clear();

    // PSK
    if (!aConfig.mPSK.empty())
    {
        mPSK = aConfig.mPSK;
        mCipherSuites.push_back(MBEDTLS_TLS_ECJPAKE_WITH_AES_128_CCM_8);
    }

    // X509
    if (!aConfig.mCaChain.empty() || !aConfig.mOwnCert.empty() || !aConfig.mOwnKey.empty())
    {
        if (int fail = mbedtls_x509_crt_parse(&mCaChain, &aConfig.mCaChain[0], aConfig.mCaChain.size()))
        {
            ExitNow(error = ERROR_INVALID_ARGS("bad CA certificate; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }
        if (int fail = mbedtls_x509_crt_parse(&mOwnCert, &aConfig.mOwnCert[0], aConfig.mOwnCert.size()))
        {
            ExitNow(error = ERROR_INVALID_ARGS("bad certificate; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }
        if (int fail = mbedtls_pk_parse_key(&mOwnKey, &aConfig.mOwnKey[0], aConfig.mOwnKey.size(), nullptr, 0,
                                            mbedtls_ctr_drbg_random, &mCtrDrbg))
        {
            ExitNow(error = ERROR_INVALID_ARGS("bad private key; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }

        mCipherSuites.push_back(MBEDTLS_TLS_ECDHE_ECDSA_WITH_AES_128_CCM_8);

        mbedtls_ssl_conf_ca_chain(&mConfig, &mCaChain, nullptr);
        if (int fail = mbedtls_ssl_conf_own_cert(&mConfig, &mOwnCert, &mOwnKey))
        {
            ExitNow(error = ErrorFromMbedtlsError(fail));
        }
    }

    mCipherSuites.push_back(0);
    mbedtls_ssl_conf_ciphersuites(&mConfig, &mCipherSuites[0]);

    mbedtls_ssl_set_export_keys_cb(&mSsl, HandleMbedtlsExportKeys, this);
    mbedtls_ssl_conf_rng(&mConfig, mbedtls_ctr_drbg_random, &mCtrDrbg);

    // Cookie
    if (mIsServer)
    {
        if (int fail = mbedtls_ssl_cookie_setup(&mCookie, mbedtls_ctr_drbg_random, &mCtrDrbg))
        {
            ExitNow(error = ErrorFromMbedtlsError(fail));
        }
        mbedtls_ssl_conf_dtls_cookies(&mConfig, mbedtls_ssl_cookie_write, mbedtls_ssl_cookie_check, &mCookie);
    }

    // bio
    // mbedtls_ssl_set_bio(&mSsl, &mNetCtx, mbedtls_net_send, mbedtls_net_recv, nullptr);
    mbedtls_ssl_set_bio(&mSsl, mSocket.get(), Socket::Send, Socket::Receive, nullptr);

    // Timer
    mbedtls_ssl_set_timer_cb(&mSsl, &mHandshakeTimer, DtlsTimer::SetDelay, DtlsTimer::GetDelay);

    if (int fail = mbedtls_ssl_conf_max_frag_len(&mConfig, KMaxFragmentLengthCode))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    // MTU
    mbedtls_ssl_set_mtu(&mSsl, kMaxTransmissionUnit);

    // Setup
    if (int fail = mbedtls_ssl_setup(&mSsl, &mConfig))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    // Set EC-JPAKE password after initializing the SSL object.
    if (!aConfig.mPSK.empty())
    {
        if (int fail = mbedtls_ssl_set_hs_ecjpake_password(&mSsl, aConfig.mPSK.data(), aConfig.mPSK.size()))
        {
            ExitNow(error =
                        ERROR_SECURITY("set DTLS pre-shared key failed; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }
    }

exit:
    return error;
}